

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::parse_query_text(string *s,Params *params)

{
  char *b;
  char *e;
  Params *params_local;
  string *s_local;
  
  b = (char *)std::__cxx11::string::operator[]((ulong)s);
  std::__cxx11::string::size();
  e = (char *)std::__cxx11::string::operator[]((ulong)s);
  split<httplib::detail::parse_query_text(std::__cxx11::string_const&,std::multimap<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(char_const*,char_const*)_1_>
            (b,e,'&',(anon_class_8_1_65ceeac4)params);
  return;
}

Assistant:

inline void parse_query_text(const std::string &s, Params &params) {
  split(&s[0], &s[s.size()], '&', [&](const char *b, const char *e) {
    std::string key;
    std::string val;
    split(b, e, '=', [&](const char *b, const char *e) {
      if (key.empty()) {
        key.assign(b, e);
      } else {
        val.assign(b, e);
      }
    });
    params.emplace(key, decode_url(val));
  });
}